

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions<google::protobuf::EnumDescriptor>
          (DescriptorBuilder *this,OptionsType *orig_options,EnumDescriptor *descriptor,
          int options_field_tag)

{
  vector<int,_std::allocator<int>_> options_path;
  int local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c = options_field_tag;
  EnumDescriptor::GetLocationPath(descriptor,(vector<int,_std::allocator<int>_> *)&local_38);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)&local_38,&local_3c);
  AllocateOptionsImpl<google::protobuf::EnumDescriptor>
            (this,*(string **)(descriptor + 8),*(string **)(descriptor + 8),orig_options,descriptor,
             (vector<int,_std::allocator<int>_> *)&local_38);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(
    const typename DescriptorT::OptionsType& orig_options,
    DescriptorT* descriptor, int options_field_tag) {
  std::vector<int> options_path;
  descriptor->GetLocationPath(&options_path);
  options_path.push_back(options_field_tag);
  AllocateOptionsImpl(descriptor->full_name(), descriptor->full_name(),
                      orig_options, descriptor, options_path);
}